

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_catalog(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  FILE *pFVar11;
  long lVar12;
  xmlDocPtr val;
  bool bVar13;
  int test_ret_1;
  int n_filename;
  FILE *in_RSI;
  FILE *pFVar14;
  char *pcVar15;
  int n_URI;
  ulong uVar16;
  ulong uVar17;
  int n_type;
  uint uVar18;
  int local_58;
  int local_54;
  int local_50;
  int test_ret_2;
  int test_ret;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing catalog : 27 of 36 functions ...");
  }
  uVar17 = 1;
  local_58 = 0;
  while (uVar17 != 0) {
    uVar16 = 0;
    while( true ) {
      uVar17 = 0;
      iVar3 = (int)uVar16;
      if (iVar3 == 5) break;
      while (iVar5 = (int)uVar17, iVar5 != 5) {
        pFVar14 = (FILE *)0x0;
        while( true ) {
          iVar2 = (int)in_RSI;
          iVar4 = (int)pFVar14;
          if (iVar4 == 5) break;
          iVar1 = xmlMemBlocks();
          in_RSI = (FILE *)gen_const_xmlChar_ptr(iVar3,iVar2);
          pxVar9 = gen_const_xmlChar_ptr(iVar5,iVar2);
          pxVar10 = gen_const_xmlChar_ptr(iVar4,iVar2);
          xmlACatalogAdd(0,in_RSI,pxVar9,pxVar10);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlACatalogAdd",(ulong)(uint)(iVar2 - iVar1));
            local_58 = local_58 + 1;
            printf(" %d",0);
            printf(" %d",uVar16);
            printf(" %d",uVar17);
            printf(" %d");
            putchar(10);
            in_RSI = pFVar14;
          }
          pFVar14 = (FILE *)(ulong)(iVar4 + 1);
        }
        uVar17 = (ulong)(iVar5 + 1);
      }
      uVar16 = (ulong)(iVar3 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar13 = true;
  local_50 = 0;
  while (bVar13) {
    pFVar14 = (FILE *)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar5 = (int)pFVar14;
      if (iVar5 == 2) break;
      iVar2 = xmlMemBlocks();
      pFVar11 = (FILE *)gen_FILE_ptr(iVar5,iVar3);
      in_RSI = pFVar11;
      xmlACatalogDump();
      call_tests = call_tests + 1;
      if (pFVar11 != (FILE *)0x0) {
        fclose(pFVar11);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlACatalogDump",(ulong)(uint)(iVar3 - iVar2));
        local_50 = local_50 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pFVar14;
      }
      pFVar14 = (FILE *)(ulong)(iVar5 + 1);
    }
    bVar13 = false;
  }
  function_tests = function_tests + 1;
  bVar13 = true;
  local_54 = 0;
  while (bVar13) {
    pFVar14 = (FILE *)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar5 = (int)pFVar14;
      if (iVar5 == 5) break;
      iVar2 = xmlMemBlocks();
      in_RSI = (FILE *)gen_const_xmlChar_ptr(iVar5,iVar3);
      xmlACatalogRemove();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlACatalogRemove",(ulong)(uint)(iVar3 - iVar2));
        local_54 = local_54 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pFVar14;
      }
      pFVar14 = (FILE *)(ulong)(iVar5 + 1);
    }
    bVar13 = false;
  }
  function_tests = function_tests + 1;
  pFVar14 = (FILE *)0x1;
  test_ret_2 = 0;
  while (pFVar14 != (FILE *)0x0) {
    uVar17 = 0;
    while( true ) {
      pFVar14 = (FILE *)0x0;
      iVar3 = (int)uVar17;
      if (iVar3 == 5) break;
      while( true ) {
        iVar5 = (int)in_RSI;
        iVar2 = (int)pFVar14;
        if (iVar2 == 5) break;
        iVar4 = xmlMemBlocks();
        in_RSI = (FILE *)gen_const_xmlChar_ptr(iVar3,iVar5);
        pxVar9 = gen_const_xmlChar_ptr(iVar2,iVar5);
        lVar12 = xmlACatalogResolve(0,in_RSI,pxVar9);
        if (lVar12 != 0) {
          (*_xmlFree)();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlACatalogResolve",(ulong)(uint)(iVar5 - iVar4));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",0);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = pFVar14;
        }
        pFVar14 = (FILE *)(ulong)(iVar2 + 1);
      }
      uVar17 = (ulong)(iVar3 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar13 = true;
  local_34 = 0;
  while (bVar13) {
    pFVar14 = (FILE *)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar5 = (int)pFVar14;
      if (iVar5 == 5) break;
      iVar2 = xmlMemBlocks();
      in_RSI = (FILE *)gen_const_xmlChar_ptr(iVar5,iVar3);
      lVar12 = xmlACatalogResolvePublic();
      if (lVar12 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlACatalogResolvePublic",(ulong)(uint)(iVar3 - iVar2));
        local_34 = local_34 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pFVar14;
      }
      pFVar14 = (FILE *)(ulong)(iVar5 + 1);
    }
    bVar13 = false;
  }
  function_tests = function_tests + 1;
  bVar13 = true;
  iVar3 = 0;
  while (bVar13) {
    pFVar14 = (FILE *)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar2 = (int)pFVar14;
      if (iVar2 == 5) break;
      iVar4 = xmlMemBlocks();
      in_RSI = (FILE *)gen_const_xmlChar_ptr(iVar2,iVar5);
      lVar12 = xmlACatalogResolveSystem();
      if (lVar12 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlACatalogResolveSystem",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pFVar14;
      }
      pFVar14 = (FILE *)(ulong)(iVar2 + 1);
    }
    bVar13 = false;
  }
  function_tests = function_tests + 1;
  bVar13 = true;
  test_ret = 0;
  while (bVar13) {
    pFVar14 = (FILE *)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar2 = (int)pFVar14;
      if (iVar2 == 5) break;
      iVar4 = xmlMemBlocks();
      in_RSI = (FILE *)gen_const_xmlChar_ptr(iVar2,iVar5);
      lVar12 = xmlACatalogResolveURI();
      if (lVar12 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlACatalogResolveURI",(ulong)(uint)(iVar5 - iVar4));
        test_ret = test_ret + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pFVar14;
      }
      pFVar14 = (FILE *)(ulong)(iVar2 + 1);
    }
    bVar13 = false;
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (uVar18 = 0; uVar18 != 5; uVar18 = uVar18 + 1) {
    uVar17 = 0;
    while (iVar2 = (int)uVar17, iVar2 != 5) {
      pFVar14 = (FILE *)0x0;
      while( true ) {
        iVar4 = (int)in_RSI;
        iVar1 = (int)pFVar14;
        if (iVar1 == 5) break;
        iVar6 = xmlMemBlocks();
        pxVar9 = gen_const_xmlChar_ptr(uVar18,iVar4);
        in_RSI = (FILE *)gen_const_xmlChar_ptr(iVar2,iVar4);
        pxVar10 = gen_const_xmlChar_ptr(iVar1,iVar4);
        xmlCatalogAdd(pxVar9,in_RSI,pxVar10);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar6 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCatalogAdd",(ulong)(uint)(iVar4 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar18);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = pFVar14;
        }
        pFVar14 = (FILE *)(ulong)(iVar1 + 1);
      }
      uVar17 = (ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  xmlCatalogCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  xmlCatalogConvert();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  iVar2 = 0;
  pFVar14 = (FILE *)0x0;
  while (iVar4 = (int)pFVar14, iVar4 != 2) {
    iVar1 = xmlMemBlocks();
    pFVar11 = (FILE *)gen_FILE_ptr(iVar4,(int)in_RSI);
    xmlCatalogDump();
    call_tests = call_tests + 1;
    if (pFVar11 != (FILE *)0x0) {
      fclose(pFVar11);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar1 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogDump",(ulong)(uint)(iVar6 - iVar1));
      iVar2 = iVar2 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pFVar14;
    }
    pFVar14 = (FILE *)(ulong)(iVar4 + 1);
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlCatalogGetDefaults();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar1 = xmlMemBlocks();
  if (iVar4 != iVar1) {
    iVar6 = xmlMemBlocks();
    in_RSI = (FILE *)(ulong)(uint)(iVar6 - iVar4);
    printf("Leak of %d blocks found in xmlCatalogGetDefaults");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar3 = iVar3 + test_ret + iVar5 + iVar2 +
          local_54 + test_ret_2 + local_34 + local_58 + local_50 + (uint)(iVar4 != iVar1);
  bVar13 = true;
  while (bVar13) {
    iVar5 = xmlMemBlocks();
    xmlCatalogIsEmpty(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar5 == iVar2) break;
    xmlMemBlocks();
    bVar13 = false;
    printf("Leak of %d blocks found in xmlCatalogIsEmpty");
    in_RSI = (FILE *)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + 1;
  }
  function_tests = function_tests + 1;
  local_58 = 0;
  for (uVar18 = 0; uVar18 != 2; uVar18 = uVar18 + 1) {
    uVar17 = 0;
    while (iVar5 = (int)uVar17, iVar5 != 5) {
      pFVar14 = (FILE *)0x0;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar4 = (int)pFVar14;
        if (iVar4 == 5) break;
        iVar1 = xmlMemBlocks();
        in_RSI = (FILE *)gen_const_xmlChar_ptr(iVar5,iVar2);
        pxVar9 = gen_const_xmlChar_ptr(iVar4,iVar2);
        lVar12 = xmlCatalogLocalResolve(0,in_RSI,pxVar9);
        if (lVar12 != 0) {
          (*_xmlFree)();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCatalogLocalResolve",(ulong)(uint)(iVar2 - iVar1));
          local_58 = local_58 + 1;
          printf(" %d",(ulong)uVar18);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
          in_RSI = pFVar14;
        }
        pFVar14 = (FILE *)(ulong)(iVar4 + 1);
      }
      uVar17 = (ulong)(iVar5 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  for (uVar18 = 0; uVar18 != 2; uVar18 = uVar18 + 1) {
    pFVar14 = (FILE *)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar2 = (int)pFVar14;
      if (iVar2 == 5) break;
      iVar4 = xmlMemBlocks();
      in_RSI = (FILE *)gen_const_xmlChar_ptr(iVar2,iVar5);
      lVar12 = xmlCatalogLocalResolveURI();
      if (lVar12 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCatalogLocalResolveURI",(ulong)(uint)(iVar5 - iVar4));
        test_ret_2 = test_ret_2 + 1;
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
        in_RSI = pFVar14;
      }
      pFVar14 = (FILE *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
    gen_const_xmlChar_ptr(iVar5,(int)in_RSI);
    xmlCatalogRemove();
    call_tests = call_tests + 1;
    xmlResetLastError();
  }
  function_tests = function_tests + 1;
  for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
    gen_const_xmlChar_ptr(iVar5,(int)in_RSI);
    for (iVar2 = 0; iVar2 != 5; iVar2 = iVar2 + 1) {
      in_RSI = (FILE *)gen_const_xmlChar_ptr(iVar2,(int)in_RSI);
      lVar12 = xmlCatalogResolve();
      if (lVar12 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
    }
  }
  function_tests = function_tests + 1;
  local_50 = 0;
  for (uVar18 = 0; uVar18 != 5; uVar18 = uVar18 + 1) {
    iVar5 = xmlMemBlocks();
    gen_const_xmlChar_ptr(uVar18,(int)in_RSI);
    lVar12 = xmlCatalogResolvePublic();
    if (lVar12 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar5 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogResolvePublic",(ulong)(uint)(iVar2 - iVar5));
      local_50 = local_50 + 1;
      in_RSI = (FILE *)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_54 = 0;
  for (uVar18 = 0; uVar18 != 5; uVar18 = uVar18 + 1) {
    iVar5 = xmlMemBlocks();
    gen_const_xmlChar_ptr(uVar18,(int)in_RSI);
    lVar12 = xmlCatalogResolveSystem();
    if (lVar12 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar5 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogResolveSystem",(ulong)(uint)(iVar2 - iVar5));
      local_54 = local_54 + 1;
      in_RSI = (FILE *)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (uVar18 = 0; uVar18 != 5; uVar18 = uVar18 + 1) {
    iVar2 = xmlMemBlocks();
    gen_const_xmlChar_ptr(uVar18,(int)in_RSI);
    lVar12 = xmlCatalogResolveURI();
    if (lVar12 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar2 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogResolveURI",(ulong)(uint)(iVar4 - iVar2));
      iVar5 = iVar5 + 1;
      in_RSI = (FILE *)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar18 = 0; uVar18 != 3; uVar18 = uVar18 + 1) {
    iVar4 = xmlMemBlocks();
    xmlCatalogSetDefaultPrefer();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar4 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogSetDefaultPrefer",(ulong)(uint)(iVar1 - iVar4));
      iVar2 = iVar2 + 1;
      in_RSI = (FILE *)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  uVar18 = 0xffffffff;
  iVar4 = 0;
  while (uVar18 != 3) {
    uVar18 = uVar18 + 1;
    iVar1 = xmlMemBlocks();
    xmlCatalogSetDefaults();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar1 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogSetDefaults",(ulong)(uint)(iVar6 - iVar1));
      iVar4 = iVar4 + 1;
      in_RSI = (FILE *)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar5 = iVar5 + iVar2 + iVar4 + local_50 + local_54 + local_58 + test_ret_2;
  iVar2 = -(iVar5 + iVar3);
  bVar13 = true;
  while (bVar13) {
    iVar4 = xmlMemBlocks();
    xmlConvertSGMLCatalog(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar4 == iVar1) break;
    xmlMemBlocks();
    bVar13 = false;
    printf("Leak of %d blocks found in xmlConvertSGMLCatalog");
    in_RSI = (FILE *)0x0;
    printf(" %d");
    putchar(10);
    iVar2 = iVar2 + -1;
    iVar5 = iVar5 + 1;
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlInitializeCatalog();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar1 = xmlMemBlocks();
  iVar6 = 0;
  if (iVar4 != iVar1) {
    iVar7 = xmlMemBlocks();
    in_RSI = (FILE *)(ulong)(uint)(iVar7 - iVar4);
    printf("Leak of %d blocks found in xmlInitializeCatalog");
    putchar(10);
  }
  function_tests = function_tests + 1;
  for (; iVar6 != 8; iVar6 = iVar6 + 1) {
    gen_filepath(iVar6,(int)in_RSI);
    xmlLoadCatalog();
    call_tests = call_tests + 1;
    xmlResetLastError();
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  do {
    pcVar15 = "foo";
    switch(iVar6) {
    case 0:
      break;
    case 1:
      pcVar15 = "<foo/>";
      break;
    case 2:
      pcVar15 = "test/ent2";
      break;
    default:
      pcVar15 = (char *)0x0;
      break;
    case 4:
      function_tests = function_tests + 1;
      iVar6 = 0;
      for (uVar18 = 0; uVar18 != 8; uVar18 = uVar18 + 1) {
        iVar7 = xmlMemBlocks();
        pcVar15 = gen_filepath(uVar18,(int)in_RSI);
        val = (xmlDocPtr)xmlParseCatalogFile(pcVar15);
        desret_xmlDocPtr(val);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlParseCatalogFile",(ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          in_RSI = (FILE *)(ulong)uVar18;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      iVar6 = (uint)(iVar4 != iVar1) + iVar6;
      uVar18 = iVar5 + iVar3 + iVar6;
      if (iVar6 != iVar2) {
        printf("Module catalog: %d errors\n",(ulong)uVar18);
      }
      return uVar18;
    }
    xmlLoadCatalogs(pcVar15);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

static int
test_catalog(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing catalog : 27 of 36 functions ...\n");
    test_ret += test_xmlACatalogAdd();
    test_ret += test_xmlACatalogDump();
    test_ret += test_xmlACatalogRemove();
    test_ret += test_xmlACatalogResolve();
    test_ret += test_xmlACatalogResolvePublic();
    test_ret += test_xmlACatalogResolveSystem();
    test_ret += test_xmlACatalogResolveURI();
    test_ret += test_xmlCatalogAdd();
    test_ret += test_xmlCatalogCleanup();
    test_ret += test_xmlCatalogConvert();
    test_ret += test_xmlCatalogDump();
    test_ret += test_xmlCatalogGetDefaults();
    test_ret += test_xmlCatalogIsEmpty();
    test_ret += test_xmlCatalogLocalResolve();
    test_ret += test_xmlCatalogLocalResolveURI();
    test_ret += test_xmlCatalogRemove();
    test_ret += test_xmlCatalogResolve();
    test_ret += test_xmlCatalogResolvePublic();
    test_ret += test_xmlCatalogResolveSystem();
    test_ret += test_xmlCatalogResolveURI();
    test_ret += test_xmlCatalogSetDefaultPrefer();
    test_ret += test_xmlCatalogSetDefaults();
    test_ret += test_xmlConvertSGMLCatalog();
    test_ret += test_xmlInitializeCatalog();
    test_ret += test_xmlLoadACatalog();
    test_ret += test_xmlLoadCatalog();
    test_ret += test_xmlLoadCatalogs();
    test_ret += test_xmlLoadSGMLSuperCatalog();
    test_ret += test_xmlNewCatalog();
    test_ret += test_xmlParseCatalogFile();

    if (test_ret != 0)
	printf("Module catalog: %d errors\n", test_ret);
    return(test_ret);
}